

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void tetrahedralize(tetgenbehavior *b,tetgenio *in,tetgenio *out,tetgenio *addin,tetgenio *bgmin)

{
  double dVar1;
  long lVar2;
  clock_t cVar3;
  tetgenmesh *__s;
  clock_t cVar4;
  clock_t cVar5;
  char *pcVar6;
  undefined4 uVar7;
  clock_t ts [5];
  tetgenmesh m;
  long local_658;
  clock_t local_650;
  clock_t local_648;
  clock_t local_640;
  tetgenmesh local_630;
  
  local_630.recentsh.sh = (shellface *)0x0;
  local_630.recentsh.shver = 0;
  local_630.highordertable = (point *)0x0;
  local_630.numpointattrib = 0;
  local_630.numelemattrib = 0;
  local_630.sizeoftensor = 0;
  local_630.pointmtrindex = 0;
  local_630.pointparamindex = 0;
  local_630.point2simindex = 0;
  local_630.pointmarkindex = 0;
  local_630.pointinsradiusindex = 0;
  local_630.elemattribindex = 0;
  local_630.volumeboundindex = 0;
  local_630.shmarkindex = 0;
  local_630.areaboundindex = 0;
  local_630.checksubsegflag = 0;
  local_630.checksubfaceflag = 0;
  local_630.checkconstraints = 0;
  local_630.nonconvex = 0;
  memset(&local_630,0,300);
  local_630.autofliplinklevel = 1;
  local_630.useinsertradius = 0;
  local_630.samples = 0;
  local_630.randomseed = 1;
  local_630.minfacetdihed = tetgenmesh::PI;
  local_630.minfaceang = tetgenmesh::PI;
  local_630.tetprism_vol_sum = 0.0;
  local_630.longest = 0.0;
  local_630.minedgelength = 0.0;
  local_630.xmax = 0.0;
  local_630.xmin = 0.0;
  local_630.ymax = 0.0;
  local_630.ymin = 0.0;
  local_630.zmax = 0.0;
  local_630.zmin = 0.0;
  local_630.insegments = 0;
  local_630.hullsize = 0;
  local_630.meshedges = 0;
  local_630.meshhulledges = 0;
  local_630.steinerleft = -1;
  memset(&local_630.dupverts,0,0x98);
  cVar3 = clock();
  local_630.in = in;
  local_630.addin = addin;
  local_630.b = b;
  if (((bgmin != (tetgenio *)0x0) && (b->metric != 0)) && (0 < bgmin->numberofpoints)) {
    __s = (tetgenmesh *)operator_new(0x600);
    (__s->recentsh).sh = (shellface *)0x0;
    (__s->recentsh).shver = 0;
    __s->highordertable = (point *)0x0;
    __s->numpointattrib = 0;
    __s->numelemattrib = 0;
    __s->sizeoftensor = 0;
    __s->pointmtrindex = 0;
    __s->pointparamindex = 0;
    __s->point2simindex = 0;
    __s->pointmarkindex = 0;
    __s->pointinsradiusindex = 0;
    __s->elemattribindex = 0;
    __s->volumeboundindex = 0;
    __s->shmarkindex = 0;
    __s->areaboundindex = 0;
    __s->checksubsegflag = 0;
    __s->checksubfaceflag = 0;
    __s->checkconstraints = 0;
    __s->nonconvex = 0;
    memset(__s,0,300);
    __s->autofliplinklevel = 1;
    __s->useinsertradius = 0;
    __s->samples = 0;
    __s->randomseed = 1;
    dVar1 = tetgenmesh::PI;
    __s->minfacetdihed = tetgenmesh::PI;
    __s->minfaceang = dVar1;
    __s->meshhulledges = 0;
    __s->hullsize = 0;
    __s->meshedges = 0;
    __s->zmin = 0.0;
    __s->insegments = 0;
    __s->ymin = 0.0;
    __s->zmax = 0.0;
    __s->xmin = 0.0;
    __s->ymax = 0.0;
    __s->minedgelength = 0.0;
    __s->xmax = 0.0;
    __s->tetprism_vol_sum = 0.0;
    __s->longest = 0.0;
    __s->steinerleft = -1;
    memset(&__s->dupverts,0,0x98);
    __s->b = b;
    __s->in = bgmin;
    local_630.bgm = __s;
  }
  tetgenmesh::initializepools(&local_630);
  tetgenmesh::transfernodes(&local_630);
  exactinit(b->verbose,b->noexact,b->nostaticfilter,local_630.xmax - local_630.xmin,
            local_630.ymax - local_630.ymin,local_630.zmax - local_630.zmin);
  cVar4 = clock();
  if (b->refine == 0) {
    tetgenmesh::incrementaldelaunay(&local_630,&local_658);
  }
  else {
    tetgenmesh::reconstructmesh(&local_630);
  }
  cVar5 = clock();
  if (b->quiet == 0) {
    uVar7 = SUB84((double)(cVar5 - cVar4) / 1000000.0,0);
    if (b->refine == 0) {
      printf("Delaunay seconds:  %g\n",uVar7);
      if (b->verbose == 0) goto LAB_0015a514;
      uVar7 = SUB84((double)(local_658 - cVar4) / 1000000.0,0);
      pcVar6 = "  Point sorting seconds:  %g\n";
    }
    else {
      pcVar6 = "Mesh reconstruction seconds:  %g\n";
    }
    printf(pcVar6,uVar7);
  }
LAB_0015a514:
  if ((b->plc != 0) && (b->refine == 0)) {
    tetgenmesh::meshsurface(&local_630);
    cVar4 = clock();
    local_658 = cVar4;
    if (b->quiet == 0) {
      printf("Surface mesh seconds:  %g\n",SUB84((double)(cVar4 - cVar5) / 1000000.0,0));
    }
    if (b->diagnose != 0) {
      tetgenmesh::detectinterfaces(&local_630);
      local_650 = clock();
      if (b->quiet == 0) {
        printf("Self-intersection seconds:  %g\n",SUB84((double)(local_650 - cVar4) / 1000000.0,0));
      }
      if (0 < (local_630.subfaces)->items) {
        tetgenmesh::outnodes(&local_630,out);
        tetgenmesh::outsubfaces(&local_630,out);
      }
      goto LAB_0015abc9;
    }
  }
  cVar4 = clock();
  if (local_630.bgm != (tetgenmesh *)0x0 && b->metric != 0) {
    tetgenmesh::initializepools(local_630.bgm);
    tetgenmesh::transfernodes(local_630.bgm);
    tetgenmesh::reconstructmesh(local_630.bgm);
    cVar5 = clock();
    local_658 = cVar5;
    if (b->quiet == 0) {
      printf("Background mesh reconstruct seconds:  %g\n",
             SUB84((double)(cVar5 - cVar4) / 1000000.0,0));
    }
    if (b->metric != 0) {
      tetgenmesh::interpolatemeshsize(&local_630);
      local_650 = clock();
      if (b->quiet == 0) {
        printf("Size interpolating seconds:  %g\n",SUB84((double)(local_650 - cVar5) / 1000000.0,0))
        ;
      }
    }
  }
  cVar4 = clock();
  if ((b->plc != 0) && (b->refine == 0)) {
    if (b->nobisect == 0) {
      tetgenmesh::constraineddelaunay(&local_630,&local_658);
    }
    else {
      tetgenmesh::recoverboundary(&local_630,&local_658);
    }
    cVar5 = clock();
    local_650 = cVar5;
    if (b->quiet == 0) {
      pcVar6 = "Boundary recovery ";
      if (b->nobisect == 0) {
        pcVar6 = "Constrained Delaunay ";
      }
      printf(pcVar6);
      printf("seconds:  %g\n",SUB84((double)(cVar5 - cVar4) / 1000000.0,0));
      lVar2 = local_658;
      if (b->verbose != 0) {
        printf("  Segment recovery seconds:  %g\n",SUB84((double)(local_658 - cVar4) / 1000000.0,0))
        ;
        printf("  Facet recovery seconds:  %g\n",SUB84((double)(cVar5 - lVar2) / 1000000.0,0));
      }
    }
    tetgenmesh::carveholes(&local_630);
    cVar4 = clock();
    local_648 = cVar4;
    if (b->quiet == 0) {
      printf("Exterior tets removal seconds:  %g\n",SUB84((double)(cVar4 - cVar5) / 1000000.0,0));
    }
    if ((b->nobisect != 0) && (0 < (local_630.subvertstack)->objects)) {
      tetgenmesh::suppresssteinerpoints(&local_630);
      local_640 = clock();
      if (b->quiet == 0) {
        printf("Steiner suppression seconds:  %g\n",SUB84((double)(local_640 - cVar4) / 1000000.0,0)
              );
      }
    }
  }
  cVar4 = clock();
  if (b->coarsen != 0) {
    tetgenmesh::meshcoarsening(&local_630);
  }
  cVar5 = clock();
  if ((b->quiet == 0) && (b->coarsen != 0)) {
    printf("Mesh coarsening seconds:  %g\n",SUB84((double)(cVar5 - cVar4) / 1000000.0,0));
  }
  if (((b->plc != 0) && (b->nobisect != 0)) || (b->coarsen != 0)) {
    tetgenmesh::recoverdelaunay(&local_630);
  }
  cVar4 = clock();
  if ((b->quiet == 0) && (((b->plc != 0 && (b->nobisect != 0)) || (b->coarsen != 0)))) {
    printf("Delaunay recovery seconds:  %g\n",SUB84((double)(cVar4 - cVar5) / 1000000.0,0));
  }
  if (((b->plc != 0) || (b->refine != 0)) &&
     ((addin != (tetgenio *)0x0 && ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    tetgenmesh::insertconstrainedpoints(&local_630,addin);
  }
  cVar5 = clock();
  if ((b->quiet == 0) &&
     ((((b->plc != 0 || (b->refine != 0)) && (addin != (tetgenio *)0x0)) &&
      ((b->insertaddpoints != 0 && (0 < addin->numberofpoints)))))) {
    printf("Constrained points seconds:  %g\n",SUB84((double)(cVar5 - cVar4) / 1000000.0,0));
  }
  if (b->quality != 0) {
    tetgenmesh::delaunayrefinement(&local_630);
  }
  cVar4 = clock();
  if ((b->quiet == 0) && (b->quality != 0)) {
    printf("Refinement seconds:  %g\n",SUB84((double)(cVar4 - cVar5) / 1000000.0,0));
  }
  if (((b->plc != 0) || (b->refine != 0)) && (0 < b->optlevel)) {
    tetgenmesh::optimizemesh(&local_630);
  }
  cVar5 = clock();
  if (((b->quiet == 0) && ((b->plc != 0 || (b->refine != 0)))) && (0 < b->optlevel)) {
    printf("Optimization seconds:  %g\n",SUB84((double)(cVar5 - cVar4) / 1000000.0,0));
  }
  if ((b->nojettison == 0) &&
     (((0 < local_630.dupverts || (0 < local_630.unuverts)) ||
      ((b->refine != 0 && (in->numberofcorners == 10)))))) {
    tetgenmesh::jettisonnodes(&local_630);
  }
  if ((b->order == 2) && (b->convex == 0)) {
    tetgenmesh::highorder(&local_630);
  }
  if (b->quiet == 0) {
    putchar(10);
  }
  if (out != (tetgenio *)0x0) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }
  if ((b->nonodewritten == 0) && (b->noiterationnum == 0)) {
    tetgenmesh::outnodes(&local_630,out);
  }
  else if (b->quiet == 0) {
    puts("NOT writing a .node file.");
  }
  if (b->noelewritten == 0) {
    if (0 < (local_630.tetrahedrons)->items) {
      tetgenmesh::outelements(&local_630,out);
    }
  }
  else {
    if (b->quiet == 0) {
      puts("NOT writing an .ele file.");
    }
    tetgenmesh::indexelements(&local_630);
  }
  if (b->nofacewritten == 0) {
    if (b->facesout == 0) {
      if ((b->plc == 0) && (b->refine == 0)) {
        if (0 < (local_630.tetrahedrons)->items) {
          tetgenmesh::outhullfaces(&local_630,out);
        }
      }
      else if (0 < (local_630.subfaces)->items) {
        tetgenmesh::outsubfaces(&local_630,out);
      }
    }
    else if (0 < (local_630.tetrahedrons)->items) {
      tetgenmesh::outfaces(&local_630,out);
    }
  }
  else if (b->quiet == 0) {
    puts("NOT writing an .face file.");
  }
  if (b->nofacewritten == 0) {
    if (b->edgesout == 0) {
      if ((b->plc != 0) || (b->refine != 0)) {
        tetgenmesh::outsubsegments(&local_630,out);
      }
    }
    else {
      tetgenmesh::outedges(&local_630,out);
    }
  }
  else if (b->quiet == 0) {
    puts("NOT writing an .edge file.");
  }
  if (((b->plc != 0) || (b->refine != 0)) && (b->metric != 0)) {
    tetgenmesh::outmetrics(&local_630,out);
  }
  if (out == (tetgenio *)0x0) {
    if ((b->plc != 0) && (b->object - OFF < 3)) {
      tetgenmesh::outsmesh(&local_630,b->outfilename);
    }
    if (b->meditview != 0) {
      tetgenmesh::outmesh2medit(&local_630,b->outfilename);
    }
    if (b->vtkview != 0) {
      tetgenmesh::outmesh2vtk(&local_630,b->outfilename);
    }
  }
  if (b->neighout != 0) {
    tetgenmesh::outneighbors(&local_630,out);
  }
  if (b->voroout != 0) {
    tetgenmesh::outvoronoi(&local_630,out);
  }
  cVar4 = clock();
  if (b->quiet == 0) {
    printf("\nOutput seconds:  %g\n",SUB84((double)(cVar4 - cVar5) / 1000000.0,0));
    printf("Total running seconds:  %g\n",SUB84((double)(cVar4 - cVar3) / 1000000.0,0));
  }
  if (b->docheck != 0) {
    tetgenmesh::checkmesh(&local_630,0);
    if ((b->plc != 0) || (b->refine != 0)) {
      tetgenmesh::checkshells(&local_630);
      tetgenmesh::checksegments(&local_630);
    }
    if (1 < b->docheck) {
      tetgenmesh::checkdelaunay(&local_630,1);
    }
  }
  if (b->quiet == 0) {
    tetgenmesh::statistics(&local_630);
  }
LAB_0015abc9:
  tetgenmesh::freememory(&local_630);
  return;
}

Assistant:

void tetrahedralize(tetgenbehavior *b, tetgenio *in, tetgenio *out,
                    tetgenio *addin, tetgenio *bgmin)
{
  tetgenmesh m;
  clock_t tv[12], ts[5]; // Timing informations (defined in time.h)
  REAL cps = (REAL) CLOCKS_PER_SEC;

  tv[0] = clock();
 
  m.b = b;
  m.in = in;
  m.addin = addin;

  if (b->metric && bgmin && (bgmin->numberofpoints > 0)) {
    m.bgm = new tetgenmesh(); // Create an empty background mesh.
    m.bgm->b = b;
    m.bgm->in = bgmin;
  }

  m.initializepools();
  m.transfernodes();

  exactinit(b->verbose, b->noexact, b->nostaticfilter,
            m.xmax - m.xmin, m.ymax - m.ymin, m.zmax - m.zmin);

  tv[1] = clock();

  if (b->refine) { // -r
    m.reconstructmesh();
  } else { // -p
    m.incrementaldelaunay(ts[0]);
  }

  tv[2] = clock();

  if (!b->quiet) {
    if (b->refine) {
      printf("Mesh reconstruction seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
    } else {
      printf("Delaunay seconds:  %g\n", ((REAL)(tv[2]-tv[1])) / cps);
      if (b->verbose) {
        printf("  Point sorting seconds:  %g\n", ((REAL)(ts[0]-tv[1])) / cps);
      }
    }
  }

  if (b->plc && !b->refine) { // -p
    m.meshsurface();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Surface mesh seconds:  %g\n", ((REAL)(ts[0]-tv[2])) / cps);
    }

    if (b->diagnose) { // -d
      m.detectinterfaces();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Self-intersection seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }

      // Only output when self-intersecting faces exist.
      if (m.subfaces->items > 0l) {
        m.outnodes(out);
        m.outsubfaces(out);
      }

      return;
    }
  }

  tv[3] = clock();

  if ((b->metric) && (m.bgm != NULL)) { // -m
    m.bgm->initializepools();
    m.bgm->transfernodes();
    m.bgm->reconstructmesh();

    ts[0] = clock();

    if (!b->quiet) {
      printf("Background mesh reconstruct seconds:  %g\n",
             ((REAL)(ts[0] - tv[3])) / cps);
    }

    if (b->metric) { // -m
      m.interpolatemeshsize();

      ts[1] = clock();

      if (!b->quiet) {
        printf("Size interpolating seconds:  %g\n",((REAL)(ts[1]-ts[0])) / cps);
      }
    }
  }

  tv[4] = clock();

  if (b->plc && !b->refine) { // -p
    if (b->nobisect) { // -Y
      m.recoverboundary(ts[0]);
    } else {
      m.constraineddelaunay(ts[0]);
    }

    ts[1] = clock();

    if (!b->quiet) {
      if (b->nobisect) {
        printf("Boundary recovery ");
      } else {
        printf("Constrained Delaunay ");
      }
      printf("seconds:  %g\n", ((REAL)(ts[1] - tv[4])) / cps);
      if (b->verbose) {
        printf("  Segment recovery seconds:  %g\n",((REAL)(ts[0]-tv[4]))/ cps);
        printf("  Facet recovery seconds:  %g\n", ((REAL)(ts[1]-ts[0])) / cps);
      }
    }

    m.carveholes();

    ts[2] = clock();

    if (!b->quiet) {
      printf("Exterior tets removal seconds:  %g\n",((REAL)(ts[2]-ts[1]))/cps);
    }

    if (b->nobisect) { // -Y
      if (m.subvertstack->objects > 0l) {
        m.suppresssteinerpoints();

        ts[3] = clock();

        if (!b->quiet) {
          printf("Steiner suppression seconds:  %g\n",
                 ((REAL)(ts[3]-ts[2]))/cps);
        }
      }
    }
  }

  tv[5] = clock();

  if (b->coarsen) { // -R
    m.meshcoarsening();
  }

  tv[6] = clock();

  if (!b->quiet) {
    if (b->coarsen) {
      printf("Mesh coarsening seconds:  %g\n", ((REAL)(tv[6] - tv[5])) / cps);
    }
  }

  if ((b->plc && b->nobisect) || b->coarsen) {
    m.recoverdelaunay();
  }

  tv[7] = clock();

  if (!b->quiet) {
    if ((b->plc && b->nobisect) || b->coarsen) {
      printf("Delaunay recovery seconds:  %g\n", ((REAL)(tv[7] - tv[6]))/cps);
    }
  }

  if ((b->plc || b->refine) && b->insertaddpoints) { // -i
    if ((addin != NULL) && (addin->numberofpoints > 0)) {
      m.insertconstrainedpoints(addin); 
    }
  }

  tv[8] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && b->insertaddpoints) { // -i
      if ((addin != NULL) && (addin->numberofpoints > 0)) {
        printf("Constrained points seconds:  %g\n", ((REAL)(tv[8]-tv[7]))/cps);
      }
    }
  }

  if (b->quality) {
    m.delaunayrefinement();    
  }

  tv[9] = clock();

  if (!b->quiet) {
    if (b->quality) {
      printf("Refinement seconds:  %g\n", ((REAL)(tv[9] - tv[8])) / cps);
    }
  }

  if ((b->plc || b->refine) && (b->optlevel > 0)) {
    m.optimizemesh();
  }

  tv[10] = clock();

  if (!b->quiet) {
    if ((b->plc || b->refine) && (b->optlevel > 0)) {
      printf("Optimization seconds:  %g\n", ((REAL)(tv[10] - tv[9])) / cps);
    }
  }

  if (!b->nojettison && ((m.dupverts > 0) || (m.unuverts > 0)
      || (b->refine && (in->numberofcorners == 10)))) {
    m.jettisonnodes();
  }

  if ((b->order == 2) && !b->convex) {
    m.highorder();
  }

  if (!b->quiet) {
    printf("\n");
  }

  if (out != (tetgenio *) NULL) {
    out->firstnumber = in->firstnumber;
    out->mesh_dim = in->mesh_dim;
  }

  if (b->nonodewritten || b->noiterationnum) {
    if (!b->quiet) {
      printf("NOT writing a .node file.\n");
    }
  } else {
    m.outnodes(out);
  }

  if (b->noelewritten) {
    if (!b->quiet) {
      printf("NOT writing an .ele file.\n");
    }
    m.indexelements();
  } else {
    if (m.tetrahedrons->items > 0l) {
      m.outelements(out);
    }
  }

  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .face file.\n");
    }
  } else {
    if (b->facesout) {
      if (m.tetrahedrons->items > 0l) {
        m.outfaces(out);  // Output all faces.
      }
    } else {
      if (b->plc || b->refine) {
        if (m.subfaces->items > 0l) {
          m.outsubfaces(out); // Output boundary faces.
        }
      } else {
        if (m.tetrahedrons->items > 0l) {
          m.outhullfaces(out); // Output convex hull faces.
        }
      }
    }
  }


  if (b->nofacewritten) {
    if (!b->quiet) {
      printf("NOT writing an .edge file.\n");
    }
  } else {
    if (b->edgesout) { // -e
      m.outedges(out); // output all mesh edges. 
    } else {
      if (b->plc || b->refine) {
        m.outsubsegments(out); // output subsegments.
      }
    }
  }

  if ((b->plc || b->refine) && b->metric) { // -m
    m.outmetrics(out);
  }

  if (!out && b->plc && 
      ((b->object == tetgenbehavior::OFF) ||
       (b->object == tetgenbehavior::PLY) ||
       (b->object == tetgenbehavior::STL))) {
    m.outsmesh(b->outfilename);
  }

  if (!out && b->meditview) {
    m.outmesh2medit(b->outfilename); 
  }


  if (!out && b->vtkview) {
    m.outmesh2vtk(b->outfilename); 
  }

  if (b->neighout) {
    m.outneighbors(out);
  }

  if (b->voroout) {
    m.outvoronoi(out);
  }


  tv[11] = clock();

  if (!b->quiet) {
    printf("\nOutput seconds:  %g\n", ((REAL)(tv[11] - tv[10])) / cps);
    printf("Total running seconds:  %g\n", ((REAL)(tv[11] - tv[0])) / cps);
  }

  if (b->docheck) {
    m.checkmesh(0);
    if (b->plc || b->refine) {
      m.checkshells();
      m.checksegments();
    }
    if (b->docheck > 1) {
      m.checkdelaunay();
    }
  }

  if (!b->quiet) {
    m.statistics();
  }
}